

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

int set_contains_which(set dest,set src,set_key *key)

{
  set_contains_which_cb_iterator_type args;
  set local_28;
  int local_20;
  set_key local_18;
  
  local_20 = 1;
  local_18 = (set_key)0x0;
  local_28 = dest;
  set_iterate(src,set_contains_which_cb_iterate,&local_28);
  *key = local_18;
  return local_20;
}

Assistant:

int set_contains_which(set dest, set src, set_key *key)
{
	struct set_contains_which_cb_iterator_type args;

	args.s = dest;
	args.result = 1;
	args.key = NULL;

	set_iterate(src, &set_contains_which_cb_iterate, (set_cb_iterate_args)&args);

	/* Return which is the duplicated key if any */
	*key = args.key;

	return args.result;
}